

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

bool helics::core::matchingTypes(string_view type1,string_view type2)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  char *in_RCX;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  size_t in_RDI;
  value_type *res;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __x._M_str = (char *)in_RSI;
  __x._M_len = in_RDI;
  __y._M_str = in_RCX;
  __y._M_len = (size_t)in_RDX;
  bVar1 = std::operator==(__x,__y);
  if (((!bVar1) &&
      (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), !bVar1)
      ) && (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_28),
           !bVar1)) {
    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (in_RSI,in_RDI,(size_type)in_RCX,(char *)in_RDX);
    if ((iVar2 != 0) &&
       (iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (in_RSI,in_RDI,(size_type)in_RCX,(char *)in_RDX), iVar2 != 0)) {
      pvVar3 = frozen::
               set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         (in_RDX,in_stack_ffffffffffffffb0);
      pvVar5 = pvVar3;
      pvVar4 = frozen::
               set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x65cb75);
      if (pvVar3 == pvVar4) {
        pvVar5 = frozen::
                 set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                 ::find<std::basic_string_view<char,std::char_traits<char>>>(in_RDX,pvVar5);
        pvVar3 = frozen::
                 set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)0x65cbb5);
        return pvVar5 != pvVar3;
      }
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool matchingTypes(std::string_view type1, std::string_view type2)
{
    if (type1 == type2) {
        return true;
    }
    if ((type1.empty()) || (type2.empty())) {
        return true;
    }
    if ((type1.compare(0, 3, "def") == 0) || (type2.compare(0, 3, "def") == 0)) {
        return true;
    }
    const auto* res = global_match_strings.find(type1);
    if (res != global_match_strings.end()) {
        return true;
    }
    res = global_match_strings.find(type2);
    return (res != global_match_strings.end());
}